

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O3

bool __thiscall cmdline::parser::parse(parser *this,int argc,char **argv)

{
  undefined1 uVar1;
  size_type __len1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  _Base_ptr p_Var9;
  char *pcVar10;
  size_type sVar11;
  const_iterator cVar12;
  mapped_type *ppoVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  char *pcVar18;
  long lVar19;
  parser *this_00;
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  int iVar22;
  _Self __tmp;
  long lVar23;
  _Self __tmp_1;
  bool bVar24;
  char initial;
  string name;
  string val;
  char last;
  map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  lookup;
  char local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  char **local_b0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_a8;
  parser *local_a0;
  int local_94;
  _Base_ptr local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  local_a8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors;
  local_b0 = argv;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_a8,
                    (this->errors).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->others;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38,
                    (this->others).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_94 = argc;
  if (argc < 1) {
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"argument number must be longer than 0","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              (local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_68);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
    }
    bVar24 = false;
  }
  else {
    iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&this->prog_name,"");
    if (iVar3 == 0) {
      pcVar18 = *local_b0;
      __len1 = (this->prog_name)._M_string_length;
      sVar5 = strlen(pcVar18);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&this->prog_name,0,__len1,pcVar18,sVar5);
    }
    local_68._24_8_ = local_68 + 8;
    local_68._8_4_ = _S_red;
    local_68._16_8_ = (_Base_ptr)0x0;
    local_40 = 0;
    p_Var7 = (this->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_90 = &(this->options)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_a0 = this;
    local_48 = (_Base_ptr)local_68._24_8_;
    if (p_Var7 != local_90) {
      do {
        if ((p_Var7[1]._M_parent != (_Base_ptr)0x0) &&
           (local_f1 = (**(code **)(**(long **)(p_Var7 + 2) + 0x48))(), local_f1 != '\0')) {
          if ((_Base_ptr)local_68._16_8_ != (_Base_ptr)0x0) {
            p_Var21 = (_Base_ptr)local_68._16_8_;
            p_Var17 = (_Base_ptr)(local_68 + 8);
            do {
              p_Var20 = p_Var17;
              p_Var16 = p_Var21;
              uVar1 = (undefined1)p_Var16[1]._M_color;
              p_Var17 = p_Var16;
              if ((char)uVar1 < local_f1) {
                p_Var17 = p_Var20;
              }
              p_Var21 = (&p_Var16->_M_left)[(char)uVar1 < local_f1];
            } while ((&p_Var16->_M_left)[(char)uVar1 < local_f1] != (_Base_ptr)0x0);
            if (p_Var17 != (_Base_ptr)(local_68 + 8)) {
              if ((char)uVar1 < local_f1) {
                p_Var16 = p_Var20;
              }
              if ((char)p_Var16[1]._M_color <= local_f1) {
                pmVar6 = std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_68,&local_f1);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_replace(pmVar6,0,pmVar6->_M_string_length,"",0);
                local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_88,"short option \'","");
                pbVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_replace_aux(&local_88,local_88._M_string_length,0,1,local_f1);
                local_d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                paVar14 = &pbVar8->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p == paVar14) {
                  local_d0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                  local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                }
                else {
                  local_d0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                }
                local_d0._M_string_length = pbVar8->_M_string_length;
                (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
                pbVar8->_M_string_length = 0;
                (pbVar8->field_2)._M_local_buf[0] = '\0';
                pbVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_d0,"\' is ambiguous");
                local_f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                paVar14 = &pbVar8->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p == paVar14) {
                  local_f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                  local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                }
                else {
                  local_f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
                }
                local_f0._M_string_length = pbVar8->_M_string_length;
                (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
                pbVar8->_M_string_length = 0;
                (pbVar8->field_2)._M_local_buf[0] = '\0';
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_a8,&local_f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p,
                                  local_d0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
                bVar24 = false;
                goto LAB_0013017e;
              }
            }
          }
          pmVar6 = std::
                   map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_68,&local_f1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (pmVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var7 + 1));
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while (p_Var7 != local_90);
    }
    this_00 = local_a0;
    if (local_94 != 1) {
      iVar3 = 1;
      do {
        pcVar18 = local_b0[iVar3];
        iVar22 = iVar3;
        if (*pcVar18 != '-') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,pcVar18,(allocator<char> *)&local_d0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_38,&local_f0);
          goto LAB_001302e4;
        }
        if (pcVar18[1] == '-') {
          pcVar18 = pcVar18 + 2;
          pcVar10 = strchr(pcVar18,0x3d);
          if (pcVar10 == (char *)0x0) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            sVar5 = strlen(pcVar18);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,pcVar18,pcVar18 + sVar5);
            cVar12 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                             *)this_00,&local_f0);
            if (cVar12._M_node == local_90) {
              std::operator+(&local_d0,"undefined option: --",&local_f0);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_a8,&local_d0);
              goto LAB_001302a3;
            }
            ppoVar13 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                       ::operator[](&this_00->options,&local_f0);
            iVar4 = (*(*ppoVar13)->_vptr_option_base[2])();
            if ((char)iVar4 == '\0') {
              set_option(this_00,&local_f0);
            }
            else {
              iVar22 = iVar3 + 1;
              if (local_94 <= iVar22) {
                std::operator+(&local_d0,"option needs value: --",&local_f0);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_a8,&local_d0);
                goto LAB_001302a3;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_d0,local_b0[iVar22],(allocator<char> *)&local_88);
              set_option(this_00,&local_f0,&local_d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
          else {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,pcVar18,pcVar10);
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            sVar5 = strlen(pcVar10 + 1);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,pcVar10 + 1,pcVar10 + sVar5 + 1);
            set_option(this_00,&local_f0,&local_d0);
LAB_001302a3:
            iVar22 = iVar3;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
          }
LAB_001302e4:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          if (pcVar18[1] == '\0') goto LAB_00130803;
          local_88._M_dataplus._M_p._0_1_ = pcVar18[1];
          cVar2 = pcVar18[2];
          bVar24 = true;
          if (cVar2 != '\0') {
            lVar23 = 2;
            lVar19 = 1;
            do {
              if ((byte)(cVar2 - 0x30U) < 10) {
                pmVar6 = std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_68,(key_type *)&local_88);
                ppoVar13 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                           ::operator[](&local_a0->options,pmVar6);
                iVar4 = (*(*ppoVar13)->_vptr_option_base[2])();
                if ((char)iVar4 != '\0') {
                  pmVar6 = std::
                           map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_68,(key_type *)&local_88);
                  pcVar18 = local_b0[iVar3] + lVar23;
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                  sVar5 = strlen(pcVar18);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f0,pcVar18,pcVar18 + sVar5);
                  set_option(local_a0,pmVar6,&local_f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    operator_delete(local_f0._M_dataplus._M_p,
                                    local_f0.field_2._M_allocated_capacity + 1);
                  }
                  bVar24 = false;
                  goto LAB_001306e7;
                }
                pcVar18 = local_b0[iVar3];
              }
              local_88._M_dataplus._M_p._0_1_ = pcVar18[lVar23];
              sVar11 = std::
                       map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::count((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_68,pcVar18 + lVar19);
              if (sVar11 == 0) {
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_d0,"undefined short option: -","");
                pbVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         _M_replace_aux(&local_d0,local_d0._M_string_length,0,1,
                                        local_b0[iVar3][lVar19]);
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(pbVar8->_M_dataplus)._M_p;
                paVar15 = &pbVar8->field_2;
                if (paVar14 == paVar15) {
                  local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                  local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                }
                else {
                  local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                  local_f0._M_dataplus._M_p = (pointer)paVar14;
                }
                local_f0._M_string_length = pbVar8->_M_string_length;
                (pbVar8->_M_dataplus)._M_p = (pointer)paVar15;
                pbVar8->_M_string_length = 0;
                (pbVar8->field_2)._M_local_buf[0] = '\0';
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>(local_a8,&local_f0);
LAB_0013051c:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  local_f0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                  operator_delete(local_d0._M_dataplus._M_p,
                                  local_d0.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                pmVar6 = std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_68,local_b0[iVar3] + lVar19);
                iVar4 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (pmVar6,"");
                if (iVar4 == 0) {
                  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_d0,"ambiguous short option: -","");
                  pbVar8 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_replace_aux(&local_d0,local_d0._M_string_length,0,1,
                                          local_b0[iVar3][lVar19]);
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(pbVar8->_M_dataplus)._M_p;
                  paVar15 = &pbVar8->field_2;
                  if (paVar14 == paVar15) {
                    local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                  }
                  else {
                    local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                    local_f0._M_dataplus._M_p = (pointer)paVar14;
                  }
                  local_f0._M_string_length = pbVar8->_M_string_length;
                  (pbVar8->_M_dataplus)._M_p = (pointer)paVar15;
                  pbVar8->_M_string_length = 0;
                  (pbVar8->field_2)._M_local_buf[0] = '\0';
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>(local_a8,&local_f0);
                  goto LAB_0013051c;
                }
                pmVar6 = std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_68,local_b0[iVar3] + lVar19);
                set_option(local_a0,pmVar6);
              }
              lVar23 = lVar23 + 1;
              pcVar18 = local_b0[iVar3];
              cVar2 = pcVar18[lVar19 + 2];
              lVar19 = lVar19 + 1;
            } while (cVar2 != '\0');
            bVar24 = true;
          }
LAB_001306e7:
          paVar14 = &local_f0.field_2;
          if ((_Base_ptr)local_68._16_8_ == (_Base_ptr)0x0) {
LAB_00130741:
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d0,"undefined short option: -","");
            pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::_M_replace_aux(&local_d0,local_d0._M_string_length,0,1,
                                      (char)local_88._M_dataplus._M_p);
            local_f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
            paVar15 = &pbVar8->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p == paVar15) {
              local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
              local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              local_f0._M_dataplus._M_p = (pointer)paVar14;
            }
            else {
              local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
            }
            local_f0._M_string_length = pbVar8->_M_string_length;
            (pbVar8->_M_dataplus)._M_p = (pointer)paVar15;
            pbVar8->_M_string_length = 0;
            (pbVar8->field_2)._M_local_buf[0] = '\0';
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_a8,&local_f0);
LAB_001307cb:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != paVar14) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            this_00 = local_a0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
              this_00 = local_a0;
            }
          }
          else {
            p_Var7 = (_Base_ptr)local_68._16_8_;
            p_Var21 = (_Base_ptr)(local_68 + 8);
            do {
              p_Var16 = p_Var21;
              p_Var17 = p_Var7;
              uVar1 = (undefined1)p_Var17[1]._M_color;
              p_Var21 = p_Var17;
              if ((char)uVar1 < (char)local_88._M_dataplus._M_p) {
                p_Var21 = p_Var16;
              }
              p_Var7 = (&p_Var17->_M_left)[(char)uVar1 < (char)local_88._M_dataplus._M_p];
            } while ((&p_Var17->_M_left)[(char)uVar1 < (char)local_88._M_dataplus._M_p] !=
                     (_Base_ptr)0x0);
            if (p_Var21 == (_Base_ptr)(local_68 + 8)) goto LAB_00130741;
            if ((char)uVar1 < (char)local_88._M_dataplus._M_p) {
              p_Var17 = p_Var16;
            }
            if ((char)local_88._M_dataplus._M_p < (char)p_Var17[1]._M_color) goto LAB_00130741;
            pmVar6 = std::
                     map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_68,(key_type *)&local_88);
            iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(pmVar6,"");
            if (iVar4 == 0) {
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,"ambiguous short option: -","");
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                       _M_replace_aux(&local_d0,local_d0._M_string_length,0,1,
                                      (char)local_88._M_dataplus._M_p);
              local_f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
              paVar15 = &pbVar8->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p == paVar15) {
                local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                local_f0._M_dataplus._M_p = (pointer)paVar14;
              }
              else {
                local_f0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
              }
              local_f0._M_string_length = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar15;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_a8,&local_f0);
              goto LAB_001307cb;
            }
            this_00 = local_a0;
            if (bVar24) {
              iVar22 = iVar3 + 1;
              if (iVar22 < local_94) {
                pmVar6 = std::
                         map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)local_68,(key_type *)&local_88);
                ppoVar13 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                           ::operator[](&local_a0->options,pmVar6);
                iVar4 = (*(*ppoVar13)->_vptr_option_base[2])();
                if ((char)iVar4 != '\0') {
                  pmVar6 = std::
                           map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)local_68,(key_type *)&local_88);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_f0,local_b0[iVar22],(allocator<char> *)&local_d0);
                  set_option(local_a0,pmVar6,&local_f0);
                  this_00 = local_a0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != paVar14) {
                    operator_delete(local_f0._M_dataplus._M_p,
                                    local_f0.field_2._M_allocated_capacity + 1);
                    this_00 = local_a0;
                  }
                  goto LAB_00130803;
                }
              }
              pmVar6 = std::
                       map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_68,(key_type *)&local_88);
              set_option(local_a0,pmVar6);
              this_00 = local_a0;
              iVar22 = iVar3;
            }
          }
        }
LAB_00130803:
        iVar3 = iVar22 + 1;
      } while (iVar3 < local_94);
    }
    p_Var9 = (this_00->options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var9 != local_90) {
      do {
        cVar2 = (**(code **)(**(long **)(p_Var9 + 2) + 0x30))();
        if (cVar2 == '\0') {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,*(long *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_d0,0,0,"need option: --",0xf);
          local_f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar14 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p == paVar14) {
            local_f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          }
          else {
            local_f0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
          }
          local_f0._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar14;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_a8,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while (p_Var9 != local_90);
    }
    bVar24 = (local_a0->errors).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish ==
             (local_a0->errors).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
LAB_0013017e:
    std::
    _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_68);
  }
  return bVar24;
}

Assistant:

bool parse(int argc, const char *const argv[]) {
    errors.clear();
    others.clear();

    if (argc < 1) {
      errors.push_back("argument number must be longer than 0");
      return false;
    }
    if (prog_name == "")
      prog_name = argv[0];

    std::map<char, std::string> lookup;
    for (std::map<std::string, option_base *>::iterator p = options.begin();
         p != options.end(); p++) {
      if (p->first.length() == 0)
        continue;
      char initial = p->second->short_name();
      if (initial) {
        if (lookup.count(initial) > 0) {
          lookup[initial] = "";
          errors.push_back(std::string("short option '") + initial +
                           "' is ambiguous");
          return false;
        }
        else
          lookup[initial] = p->first;
      }
    }

    for (int i = 1; i < argc; i++) {
      if (strncmp(argv[i], "--", 2) == 0) {
        const char *p = strchr(argv[i] + 2, '=');
        if (p) {
          std::string name(argv[i] + 2, p);
          std::string val(p + 1);
          set_option(name, val);
        }
        else {
          std::string name(argv[i] + 2);
          if (options.count(name) == 0) {
            errors.push_back("undefined option: --" + name);
            continue;
          }
          if (options[name]->has_value()) {
            if (i + 1 >= argc) {
              errors.push_back("option needs value: --" + name);
              continue;
            }
            else {
              i++;
              set_option(name, argv[i]);
            }
          }
          else {
            set_option(name);
          }
        }
      }
      else if (strncmp(argv[i], "-", 1) == 0) {
        if (!argv[i][1])
          continue;
        char last = argv[i][1];
        bool jump_next = false;
        for (int j = 2; argv[i][j]; j++) {
          if (argv[i][j] >= '0' && argv[i][j] <= '9' &&
              options[lookup[last]]->has_value()) {
            set_option(lookup[last], &argv[i][j]);
            jump_next = true;
            break;
          }
          last = argv[i][j];
          if (lookup.count(argv[i][j - 1]) == 0) {
            errors.push_back(std::string("undefined short option: -") +
                             argv[i][j - 1]);
            continue;
          }
          if (lookup[argv[i][j - 1]] == "") {
            errors.push_back(std::string("ambiguous short option: -") +
                             argv[i][j - 1]);
            continue;
          }
          set_option(lookup[argv[i][j - 1]]);
        }

        if (lookup.count(last) == 0) {
          errors.push_back(std::string("undefined short option: -") + last);
          continue;
        }
        if (lookup[last] == "") {
          errors.push_back(std::string("ambiguous short option: -") + last);
          continue;
        }
        if (jump_next) {
          continue;
        }
        if (i + 1 < argc && options[lookup[last]]->has_value()) {
          set_option(lookup[last], argv[i + 1]);
          i++;
        }
        else {
          set_option(lookup[last]);
        }
      }
      else {
        others.push_back(argv[i]);
      }
    }

    for (std::map<std::string, option_base *>::iterator p = options.begin();
         p != options.end(); p++)
      if (!p->second->valid())
        errors.push_back("need option: --" + std::string(p->first));

    return errors.size() == 0;
  }